

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O1

void __thiscall cs::instance_type::compile(instance_type *this,istream *in)

{
  element_type *peVar1;
  pointer paVar2;
  pointer paVar3;
  any *paVar4;
  char cVar5;
  any *it;
  any *this_00;
  pointer this_01;
  deque<char,_std::allocator<char>_> buff;
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  ast;
  _Deque_base<char,_std::allocator<char>_> local_c8;
  _Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  local_78;
  
  local_c8._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_c8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_c8._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_c8._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_c8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_c8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_c8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_c8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_c8._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<char,_std::allocator<char>_>::_M_initialize_map(&local_c8,0);
  cVar5 = std::istream::get();
  while (((byte)in[*(long *)(*(long *)in + -0x18) + 0x20] & 5) == 0) {
    local_78._M_impl.super__Deque_impl_data._M_map =
         (_Map_pointer)CONCAT71(local_78._M_impl.super__Deque_impl_data._M_map._1_7_,cVar5);
    if (local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
        local_c8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
      std::deque<char,_std::allocator<char>_>::_M_push_back_aux<char>
                ((deque<char,_std::allocator<char>_> *)&local_c8,(char *)&local_78);
    }
    else {
      *local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur = cVar5;
      local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur =
           local_c8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
    }
    cVar5 = std::istream::get();
  }
  local_78._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_78._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_78._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_78._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_78._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_78._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_78._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_78._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_78._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_78._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::
  _Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  ::_M_initialize_map(&local_78,0);
  peVar1 = (((this->context).super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            )->compiler).super___shared_ptr<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  paVar2 = *(pointer *)
            &(peVar1->constant_pool).super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>
  ;
  paVar3 = *(pointer *)
            ((long)&(peVar1->constant_pool).
                    super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_> + 8);
  this_01 = paVar2;
  if (paVar3 != paVar2) {
    do {
      cs_impl::any::recycle(this_01);
      this_01 = this_01 + 1;
    } while (this_01 != paVar3);
    *(pointer *)
     ((long)&(peVar1->constant_pool).super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>
     + 8) = paVar2;
  }
  compiler_type::build_ast
            ((((this->context).super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->compiler).super___shared_ptr<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr,(deque<char,_std::allocator<char>_> *)&local_c8,
             (deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
              *)&local_78,utf8);
  peVar1 = (((this->context).super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            )->compiler).super___shared_ptr<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  translator_type::translate
            (&peVar1->translator,&peVar1->context,
             (deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
              *)&local_78,&this->statements,true);
  peVar1 = (((this->context).super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            )->compiler).super___shared_ptr<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  paVar4 = *(pointer *)
            ((long)&(peVar1->constant_pool).
                    super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_> + 8);
  for (this_00 = *(any **)&(peVar1->constant_pool).
                           super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>;
      this_00 != paVar4; this_00 = this_00 + 1) {
    cs_impl::any::constant(this_00);
  }
  std::
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  ::~deque((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
            *)&local_78);
  std::_Deque_base<char,_std::allocator<char>_>::~_Deque_base(&local_c8);
  return;
}

Assistant:

void instance_type::compile(std::istream &in)
	{
		// Read from file
		std::deque<char> buff;
		for (int ch = in.get(); in; ch = in.get())
			buff.push_back(ch);
		std::deque<std::deque<token_base *>> ast;
		// Compile
		context->compiler->clear_metadata();
		context->compiler->build_ast(buff, ast);
		context->compiler->code_gen(ast, statements);
		context->compiler->utilize_metadata();
	}